

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

uint8_t m256v_LU_det(m256v *LU)

{
  uint8_t det;
  uint8_t a;
  int i;
  long lVar1;
  
  a = '\x01';
  for (lVar1 = 0; lVar1 < LU->n_col; lVar1 = lVar1 + 1) {
    a = gf256_mul(a,LU->e[lVar1 + LU->rstride * lVar1]);
  }
  return a;
}

Assistant:

MV_GEN_ELTYPE MV_GEN_N(_LU_det)(const MV_GEN_TYPE* LU)
{
	assert(LU->n_row == LU->n_col);

	MV_GEN_ELTYPE det = 1;
	for (int i = 0; i < LU->n_col; ++i) {
		det = fmul(det, MV_GEN_N(_get_el)(LU, i, i));
	}

	return det;
}